

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O2

void __thiscall
TransitionObservationIndependentMADPDiscrete::SetISD
          (TransitionObservationIndependentMADPDiscrete *this,
          vector<double,_std::allocator<double>_> *v)

{
  StateDistributionVector *this_00;
  E *this_01;
  
  if (this->_m_nrJointStates == 0) {
    this_01 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_01,
         "TransitionObservationIndependentMADPDiscrete::CreateISD() joint states should have been created already"
        );
  }
  else {
    if ((long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == this->_m_nrJointStates) {
      if (this->_m_initialStateDistribution != (StateDistributionVector *)0x0) {
        (*(this->_m_initialStateDistribution->super_StateDistribution)._vptr_StateDistribution[1])()
        ;
      }
      this_00 = (StateDistributionVector *)operator_new(0x20);
      StateDistributionVector::StateDistributionVector(this_00,v);
      this->_m_initialStateDistribution = this_00;
      return;
    }
    this_01 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_01,
         "TransitionObservationIndependentMADPDiscrete::SetISD - ERROR: nrStates don\'t match!");
  }
  __cxa_throw(this_01,&E::typeinfo,E::~E);
}

Assistant:

void  TransitionObservationIndependentMADPDiscrete::SetISD(const vector<double> &v)
{
    if(_m_nrJointStates==0)
        throw(E("TransitionObservationIndependentMADPDiscrete::CreateISD() joint states should have been created already"));
    
    if(v.size() != _m_nrJointStates)
        throw E("TransitionObservationIndependentMADPDiscrete::SetISD - ERROR: nrStates don't match!");

    delete _m_initialStateDistribution;
    _m_initialStateDistribution = new StateDistributionVector(v);
}